

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_message.c
# Opt level: O0

int main(int argc,char **argv)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  undefined8 uVar4;
  char *pcVar5;
  FILE *pFVar6;
  size_t sVar7;
  int local_84;
  int i;
  long size;
  FILE *fp2;
  FILE *fp;
  int retval;
  CMimeAddress_T *ca;
  CMimeListElem_T *elem;
  CMimeList_T *recipient_list;
  CMimeHeader_T *h;
  char *fname;
  char *msg_string;
  char *s2;
  char *s;
  CMimeMessage_T *msg;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  msg = (CMimeMessage_T *)argv;
  argv_local._0_4_ = argc;
  s = (char *)cmime_message_new();
  s2 = (char *)0x0;
  msg_string = (char *)0x0;
  fname = (char *)0x0;
  h = (CMimeHeader_T *)0x0;
  if ((int)argv_local == 2) {
    h = (CMimeHeader_T *)strdup((char *)msg->recipients);
    uVar2 = cmime_message_from_file(&s,h,1);
    if (uVar2 == 0) {
      printf("Message summary:\n=========================================\n");
      s2 = (char *)cmime_message_get_sender_string(s);
      msg_string = (char *)cmime_string_strip(s2);
      printf("Sender: [%s]\n",msg_string);
      free(s2);
      printf("Recipients (%d):\n",(ulong)**(uint **)(s + 8));
      for (ca = *(CMimeAddress_T **)(*(long *)(s + 8) + 0x10); ca != (CMimeAddress_T *)0x0;
          ca = *(CMimeAddress_T **)&ca->type) {
        s2 = (char *)cmime_address_to_string(ca->name);
        msg_string = (char *)cmime_string_strip(s2);
        printf("- [%s]\n",msg_string);
        free(s2);
      }
      uVar4 = cmime_message_get_mime_version(s);
      printf("Mime Version: [%s]\n",uVar4);
      uVar4 = cmime_message_get_content_id(s);
      printf("Content ID: [%s]\n",uVar4);
      uVar4 = cmime_message_get_content_type(s);
      printf("Content Type: [%s]\n",uVar4);
      printf("Number of message headers: [%d]\n",(ulong)**(uint **)(s + 0x10));
      printf("Number of mime parts: [%d]\n",(ulong)**(uint **)(s + 0x28));
      printf("Message boundary: [%s]\n",*(undefined8 *)(s + 0x18));
      printf("=========================================\n\n");
      fname = (char *)cmime_message_to_string(s);
      printf("%s",fname);
      free(fname);
    }
    else {
      printf("failed to parse file [%s] [%d]\n",h,(ulong)uVar2);
    }
    free(h);
    cmime_message_free(s);
  }
  else {
    cmime_message_set_sender(s,addr_string1);
    s2 = (char *)cmime_message_get_sender_string(s);
    iVar3 = strcmp(s2,addr_string1);
    if (iVar3 != 0) {
      __assert_fail("strcmp(s,addr_string1)==0",
                    "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_message.c"
                    ,0x70,"int main(int, const char **)");
    }
    free(s2);
    cmime_message_set_sender(s,addr_string2);
    s2 = (char *)cmime_message_get_sender_string(s);
    iVar3 = strcmp(s2,addr_string2);
    if (iVar3 != 0) {
      __assert_fail("strcmp(s,addr_string2)==0",
                    "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_message.c"
                    ,0x76,"int main(int, const char **)");
    }
    free(s2);
    cmime_message_set_sender_encode(s,addr_string3);
    s2 = (char *)cmime_message_get_sender_string(s);
    iVar3 = strcmp(s2,addr_string3_full_encoded);
    if (iVar3 != 0) {
      __assert_fail("strcmp(s,addr_string3_full_encoded)==0",
                    "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_message.c"
                    ,0x7c,"int main(int, const char **)");
    }
    free(s2);
    cmime_message_set_message_id(s,message_id_string);
    s2 = (char *)cmime_message_get_message_id(s);
    iVar3 = strcmp(s2,message_id_string_out);
    if (iVar3 != 0) {
      __assert_fail("strcmp(s,message_id_string_out)==0",
                    "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_message.c"
                    ,0x82,"int main(int, const char **)");
    }
    cmime_message_set_subject(s,"A subject  ");
    s2 = (char *)cmime_message_get_subject(s);
    iVar3 = strcmp(s2,"A subject");
    if (iVar3 != 0) {
      __assert_fail("strcmp(s, \"A subject\") == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_message.c"
                    ,0x86,"int main(int, const char **)");
    }
    cmime_message_set_subject_encode(s,mime_header_string1);
    s2 = (char *)cmime_message_get_subject(s);
    iVar3 = strcmp(s2,mime_header_string1_b64_encoded);
    if (iVar3 != 0) {
      __assert_fail("strcmp(s,mime_header_string1_b64_encoded)==0",
                    "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_message.c"
                    ,0x8a,"int main(int, const char **)");
    }
    iVar3 = cmime_message_set_header(s,header_string1);
    if (iVar3 != 0) {
      return -1;
    }
    uVar4 = cmime_message_get_header(s,header_string1_key);
    pcVar5 = (char *)cmime_header_get_value(uVar4,0);
    iVar3 = strcmp(pcVar5,header_string1_value);
    if (iVar3 != 0) {
      __assert_fail("strcmp(cmime_header_get_value(h,0),header_string1_value)==0",
                    "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_message.c"
                    ,0x90,"int main(int, const char **)");
    }
    iVar3 = cmime_message_set_header(s,header_string1_2);
    if (iVar3 != 0) {
      return -1;
    }
    uVar4 = cmime_message_get_header(s,header_string1_key);
    pcVar5 = (char *)cmime_header_get_value(uVar4,0);
    iVar3 = strcmp(pcVar5,header_string2_value);
    if (iVar3 != 0) {
      __assert_fail("strcmp(cmime_header_get_value(h,0),header_string2_value)==0",
                    "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_message.c"
                    ,0x97,"int main(int, const char **)");
    }
    uVar4 = cmime_message_get_header(s,header_string1_key_lower);
    pcVar5 = (char *)cmime_header_get_value(uVar4,0);
    iVar3 = strcmp(pcVar5,header_string2_value);
    if (iVar3 != 0) {
      __assert_fail("strcmp(cmime_header_get_value(h,0),header_string2_value)==0",
                    "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_message.c"
                    ,0x9b,"int main(int, const char **)");
    }
    iVar3 = cmime_message_add_recipient(s,addr_string1,0);
    if (iVar3 != 0) {
      return -1;
    }
    iVar3 = cmime_message_add_recipient(s,addr_string2,1);
    if (iVar3 != 0) {
      return -1;
    }
    iVar3 = cmime_message_add_recipient_encode(s,addr_string3,0);
    if (iVar3 != 0) {
      return -1;
    }
    lVar1 = *(long *)(s + 8);
    if (lVar1 == 0) {
      __assert_fail("recipient_list",
                    "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_message.c"
                    ,0xa8,"int main(int, const char **)");
    }
    if (*(undefined8 **)(lVar1 + 0x18) != (undefined8 *)0x0) {
      s2 = (char *)cmime_address_to_string(**(undefined8 **)(lVar1 + 0x18));
      iVar3 = strcmp(s2,addr_string3_full_encoded);
      if (iVar3 != 0) {
        __assert_fail("strcmp(s,addr_string3_full_encoded)==0",
                      "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_message.c"
                      ,0xad,"int main(int, const char **)");
      }
      free(s2);
    }
    for (ca = *(CMimeAddress_T **)(lVar1 + 0x10); ca != (CMimeAddress_T *)0x0;
        ca = *(CMimeAddress_T **)&ca->type) {
      s2 = (char *)cmime_address_to_string(ca->name);
      if (s2 == (char *)0x0) {
        __assert_fail("s",
                      "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_message.c"
                      ,0xb4,"int main(int, const char **)");
      }
      free(s2);
    }
    iVar3 = cmime_message_set_date_now(s);
    if (iVar3 != 0) {
      return -1;
    }
    s2 = (char *)cmime_message_get_date(s);
    if (s2 == (char *)0x0) {
      __assert_fail("s",
                    "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_message.c"
                    ,0xbe,"int main(int, const char **)");
    }
    s2 = (char *)cmime_message_generate_boundary();
    cmime_message_set_boundary(s,s2);
    msg_string = *(char **)(s + 0x18);
    iVar3 = strcmp(s2,msg_string);
    if (iVar3 != 0) {
      __assert_fail("strcmp(s,s2)==0",
                    "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_message.c"
                    ,0xc4,"int main(int, const char **)");
    }
    free(s2);
    cmime_message_free(s);
    for (local_84 = 0; local_84 < 0x36; local_84 = local_84 + 1) {
      printf("Checking sample message [%s]...",test_files + local_84);
      s = (char *)cmime_message_new();
      asprintf((char **)&h,"%s/%s","samples",test_files + local_84);
      iVar3 = cmime_message_from_file(&s,h,0);
      if (iVar3 != 0) {
        return iVar3;
      }
      fname = (char *)cmime_message_to_string(s);
      pFVar6 = fopen((char *)h,"rb");
      if (pFVar6 == (FILE *)0x0) {
        return -1;
      }
      free(h);
      iVar3 = fseek(pFVar6,0,2);
      if (iVar3 != 0) {
        return -1;
      }
      sVar7 = ftell(pFVar6);
      rewind(pFVar6);
      s2 = (char *)calloc(1,sVar7 + 1);
      fread(s2,sVar7,1,pFVar6);
      iVar3 = ferror(pFVar6);
      if (iVar3 != 0) {
        return -1;
      }
      fclose(pFVar6);
      asprintf(&msg_string,"out_%s",test_files + local_84);
      pFVar6 = fopen(msg_string,"wb");
      pcVar5 = fname;
      sVar7 = strlen(fname);
      fwrite(pcVar5,sVar7,1,pFVar6);
      fclose(pFVar6);
      free(msg_string);
      iVar3 = strcmp(fname,s2);
      if (iVar3 != 0) {
        __assert_fail("strcmp(msg_string,s)==0",
                      "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_message.c"
                      ,0xe9,"int main(int, const char **)");
      }
      free(s2);
      free(fname);
      cmime_message_free(s);
      printf("passed!\n");
    }
  }
  return 0;
}

Assistant:

int main (int argc, char const *argv[]) {
    CMimeMessage_T *msg = cmime_message_new();
    char *s = NULL;
    char *s2 = NULL;
    char *msg_string = NULL;
    char *fname = NULL;
    CMimeHeader_T *h = NULL;
    CMimeList_T *recipient_list = NULL;
    CMimeListElem_T *elem;
    CMimeAddress_T *ca = NULL;
    int retval = 0;
    FILE *fp = NULL;
    FILE *fp2 = NULL;
    long size = 0;
    int i = 0;

    if (argc == 2) {
        /* use message path from command line argument */
        fname = strdup(argv[1]);
        i = cmime_message_from_file(&msg,fname,1);
          
        if (i == 0) {
        
            printf("Message summary:\n=========================================\n");
            s = cmime_message_get_sender_string(msg);
            s2 = cmime_string_strip(s);
            printf("Sender: [%s]\n",s2);
            free(s);
            printf("Recipients (%d):\n",msg->recipients->size);
            elem = cmime_list_head(msg->recipients);
            while(elem != NULL) {
                ca = (CMimeAddress_T *)cmime_list_data(elem);
                s = cmime_address_to_string(ca);
                s2 = cmime_string_strip(s);
                printf("- [%s]\n",s2);
                free(s);
                elem = elem->next;
            }
            printf("Mime Version: [%s]\n",cmime_message_get_mime_version(msg));
            printf("Content ID: [%s]\n",cmime_message_get_content_id(msg));
            printf("Content Type: [%s]\n",cmime_message_get_content_type(msg));
            printf("Number of message headers: [%d]\n",msg->headers->size);
            printf("Number of mime parts: [%d]\n",cmime_message_part_count(msg));
            printf("Message boundary: [%s]\n",cmime_message_get_boundary(msg));
            printf("=========================================\n\n");

            msg_string = cmime_message_to_string(msg);
            printf("%s",msg_string);
            free(msg_string);
        } else {
            printf("failed to parse file [%s] [%d]\n",fname,i);
        } 
        free(fname);
        cmime_message_free(msg);
    } else {
        /* loop test_files */
        cmime_message_set_sender(msg,addr_string1);
        s = cmime_message_get_sender_string(msg);
        assert(strcmp(s,addr_string1)==0);
        free(s);
        
        // check if sender will be overwritten
        cmime_message_set_sender(msg,addr_string2);
        s = cmime_message_get_sender_string(msg);
        assert(strcmp(s,addr_string2)==0);
        free(s);
        
        // check mime sender header
        cmime_message_set_sender_encode(msg,addr_string3);
        s = cmime_message_get_sender_string(msg);
        assert(strcmp(s,addr_string3_full_encoded)==0);
        free(s);

        // set message id
        cmime_message_set_message_id(msg,message_id_string);
        s = cmime_message_get_message_id(msg);
        assert(strcmp(s,message_id_string_out)==0);
        
        cmime_message_set_subject(msg, "A subject  "); // IMPORTANT: with whitespaces!
        s = cmime_message_get_subject(msg);
        assert(strcmp(s, "A subject") == 0);
        
        cmime_message_set_subject_encode(msg,mime_header_string1);
        s = cmime_message_get_subject(msg);
        assert(strcmp(s,mime_header_string1_b64_encoded)==0);

        // set a test header
        if (cmime_message_set_header(msg, header_string1)!=0) 
            return(-1);
        h = cmime_message_get_header(msg,header_string1_key);
        assert(strcmp(cmime_header_get_value(h,0),header_string1_value)==0);
        
        // overwrite header
        if (cmime_message_set_header(msg, header_string1_2)!=0)
            return(-1);
            
        h = cmime_message_get_header(msg,header_string1_key);
        assert(strcmp(cmime_header_get_value(h,0),header_string2_value)==0);

        // check with lower case key
        h = cmime_message_get_header(msg,header_string1_key_lower);
        assert(strcmp(cmime_header_get_value(h,0),header_string2_value)==0);

        // check recipients
        if (cmime_message_add_recipient(msg,addr_string1,CMIME_ADDRESS_TYPE_TO)!=0)
            return(-1);
        
        if (cmime_message_add_recipient(msg,addr_string2,CMIME_ADDRESS_TYPE_CC)!=0)
            return(-1);
            
        if (cmime_message_add_recipient_encode(msg,addr_string3,CMIME_ADDRESS_TYPE_TO)!=0)
            return(-1);

        recipient_list = cmime_message_get_recipients(msg);
        assert(recipient_list);

        elem = cmime_list_tail(recipient_list);
        if (elem != NULL) {
            s = cmime_address_to_string((CMimeAddress_T *)cmime_list_data(elem));
            assert(strcmp(s,addr_string3_full_encoded)==0);
            free(s);
        }

        elem = cmime_list_head(recipient_list);
        while(elem != NULL) {
            s = cmime_address_to_string((CMimeAddress_T *)cmime_list_data(elem));
            assert(s);
            free(s);
            elem = elem->next;
        }
        
        // checking date
        if (cmime_message_set_date_now(msg)!=0)
            return(-1);
            
        s = cmime_message_get_date(msg);
        assert(s);
                
        // check boundary stuff
        s = cmime_message_generate_boundary();
        cmime_message_set_boundary(msg,s);
        s2 = cmime_message_get_boundary(msg);
        assert(strcmp(s,s2)==0);
        
        free(s);
        cmime_message_free(msg);


        for (i=0; i < 54; i++) {
            printf("Checking sample message [%s]...", test_files[i]);
            
            msg = cmime_message_new();
            asprintf(&fname,"%s/%s",SAMPLES_DIR,test_files[i]);
            retval = cmime_message_from_file(&msg,fname,0);
            if (retval != 0)
                return retval;
                
            msg_string = cmime_message_to_string(msg);
        
            if ((fp = fopen(fname, "rb")) == NULL) 
                return(-1);
            free(fname);    

            if (fseek(fp, 0, SEEK_END)!=0)
                return(-1);
            
            size = ftell(fp);
            rewind(fp); 
            s = (char*) calloc(sizeof(char), size + sizeof(char));
            fread(s, size, 1, fp);
            if(ferror(fp))
                return(-1);
            
            fclose(fp);
            asprintf(&s2,"out_%s",test_files[i]);
            fp2 = fopen(s2,"wb");
            fwrite(msg_string,strlen(msg_string),1,fp2);
            fclose(fp2);
            free(s2);
            assert(strcmp(msg_string,s)==0);
            free(s);
            free(msg_string);
            cmime_message_free(msg);
            printf("passed!\n");
        }
    }
    return(0);
}